

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O3

cmRulePlaceholderExpander * __thiscall
cmLocalNinjaGenerator::CreateRulePlaceholderExpander(cmLocalNinjaGenerator *this)

{
  cmRulePlaceholderExpander *this_00;
  long *local_38 [2];
  long local_28 [2];
  
  this_00 = (cmRulePlaceholderExpander *)operator_new(0xc0);
  cmRulePlaceholderExpander::cmRulePlaceholderExpander
            (this_00,&(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Compilers,
             &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.VariableMappings,
             &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.CompilerSysroot,
             &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.LinkerSysroot);
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"$TARGET_IMPLIB","");
  std::__cxx11::string::_M_assign((string *)this_00);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return this_00;
}

Assistant:

cmRulePlaceholderExpander*
cmLocalNinjaGenerator::CreateRulePlaceholderExpander() const
{
  cmRulePlaceholderExpander* ret =
    new cmRulePlaceholderExpander(this->Compilers, this->VariableMappings,
                                  this->CompilerSysroot, this->LinkerSysroot);
  ret->SetTargetImpLib("$TARGET_IMPLIB");
  return ret;
}